

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int cfftmf_(int *lot,int *jump,int *n,int *inc,fft_complex_t *c__,int *lenc,double *wsave,
           int *lensav,double *work,int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int iStack_40;
  
  *ier = 0;
  iVar2 = *n;
  if ((iVar2 + -1) * *inc + (*lot + -1) * *jump < *lenc) {
    iVar1 = *lensav;
    dVar3 = log((double)iVar2);
    if (iVar1 < (int)(dVar3 / 0.6931471805599453) + iVar2 * 2 + 4) {
      iStack_40 = 2;
    }
    else if (*lenwrk < *lot * *n * 2) {
      iStack_40 = 3;
    }
    else {
      iVar2 = xercon_(inc,jump,n,lot);
      if (iVar2 != 0) goto LAB_0010ebfa;
      iStack_40 = 4;
    }
  }
  else {
    iStack_40 = 1;
  }
  *ier = iStack_40;
LAB_0010ebfa:
  iVar2 = *n;
  if ((long)iVar2 != 1) {
    cmfm1f_(lot,jump,n,inc,c__,work,wsave,wsave + (long)iVar2 * 2,wsave + (long)(iVar2 * 2) + 1);
  }
  return 0;
}

Assistant:

int cfftmf_(int *lot, int *jump, int *n, int
	*inc, complex *c__, int *lenc, fft_real_t *wsave, int *lensav, fft_real_t
	*work, int *lenwrk, int *ier)
{
    /* Builtin functions */


    /* Local variables */
     int iw1;
    extern /* Subroutine */ int cmfm1f_(int *, int *, int *,
	    int *, complex *, fft_real_t *, fft_real_t *, fft_real_t *, fft_real_t *);
    extern logical xercon_(int *, int *, int *, int *);
    extern /* Subroutine */ int xerfft_(char *, int *, ftnlen);


    /* Parameter adjustments */
    --c__;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*lenc < (*lot - 1) * *jump + *inc * (*n - 1) + 1) {
	*ier = 1;
	//xerfft_("CFFTMF ", &c__6, (ftnlen)7);
    } else if (*lensav < (*n << 1) + (int) (log((fft_real_t) (*n)) / log(2.0))
	    + 4) {
	*ier = 2;
	//xerfft_("CFFTMF ", &c__8, (ftnlen)7);
    } else if (*lenwrk < (*lot << 1) * *n) {
	*ier = 3;
	//xerfft_("CFFTMF ", &c__10, (ftnlen)7);
    } else if (! xercon_(inc, jump, n, lot)) {
	*ier = 4;
	//xerfft_("CFFTMF ", &c_n1, (ftnlen)7);
    }

    if (*n == 1) {
	return 0;
    }

    iw1 = *n + *n + 1;
    cmfm1f_(lot, jump, n, inc, &c__[1], &work[1], &wsave[1], &wsave[iw1], &
	    wsave[iw1 + 1]);
    return 0;
}